

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_ParseShortRepeatedWithTrailingComma_Test::
TextFormatTest_ParseShortRepeatedWithTrailingComma_Test
          (TextFormatTest_ParseShortRepeatedWithTrailingComma_Test *this)

{
  TextFormatTest_ParseShortRepeatedWithTrailingComma_Test *this_local;
  
  TextFormatTest::TextFormatTest(&this->super_TextFormatTest);
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTest_ParseShortRepeatedWithTrailingComma_Test_029ef090;
  return;
}

Assistant:

TEST_F(TextFormatTest, ParseShortRepeatedWithTrailingComma) {
  std::string parse_string = "repeated_int32: [456,]\n";
  ASSERT_FALSE(TextFormat::ParseFromString(parse_string, &proto_));
  parse_string = "repeated_nested_enum: [  FOO , ]";
  ASSERT_FALSE(TextFormat::ParseFromString(parse_string, &proto_));
  parse_string = "repeated_string: [ \"foo\", ]";
  ASSERT_FALSE(TextFormat::ParseFromString(parse_string, &proto_));
  parse_string = "repeated_nested_message: [ { bb: 1 }, ]";
  ASSERT_FALSE(TextFormat::ParseFromString(parse_string, &proto_));
  parse_string = "RepeatedGroup [{ a: 3 },]\n";
  ASSERT_FALSE(TextFormat::ParseFromString(parse_string, &proto_));
}